

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t
bsc_collective(bsc_step_t depends,bsc_collective_t *collective,bsc_pid_t root,bsc_group_t group,
              bsc_coll_params_t params)

{
  bsc_step_t bVar1;
  int local_8c;
  bsc_size_t i;
  bsc_step_t steps;
  bsc_step_t maxsteps;
  coll_request_t r;
  request_t *req;
  bsc_group_t group_local;
  bsc_pid_t root_local;
  bsc_collective_t *collective_local;
  bsc_step_t depends_local;
  
  i = 0;
  for (local_8c = 0; local_8c < collective->n_algs; local_8c = local_8c + 1) {
    bVar1 = (*collective->maxsteps[local_8c])(group);
    if ((uint)i < bVar1) {
      i = bVar1;
    }
  }
  _steps = collective;
  r.coll._0_4_ = root;
  r._8_8_ = group;
  memcpy(&r.group,&params,0x30);
  r.params.nmemb = 0;
  r.params.size = 0;
  r.next = (coll_request *)new_request(depends);
  ((request_t *)r.next)->kind = COLL;
  memcpy(&((request_t *)r.next)->payload,&steps,0x50);
  return depends + i;
}

Assistant:

bsc_step_t bsc_collective( bsc_step_t depends,
       const bsc_collective_t * collective,
       bsc_pid_t root, bsc_group_t group, 
       bsc_coll_params_t params ) 
{
    request_t * req;
    coll_request_t r;
    bsc_step_t maxsteps = 0, steps;
    bsc_size_t i ;
    for ( i = 0; i < collective->n_algs; ++i ) 
    {
        steps = (*collective->maxsteps[i])( group );
        if ( maxsteps < steps )
            maxsteps = steps;
    }

    r.coll = collective;
    r.root = root;
    r.group = (group_t *) group;
    r.params = params;
    r.next = NULL;

    req = new_request( depends );
    req->kind = COLL;
    req->payload.coll = r;
    return depends + maxsteps;
}